

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O3

char * GetenvBeforeMain(char *name)

{
  char *pcVar1;
  char cVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  
  iVar11 = 0;
  lVar4 = 0;
  do {
    if (lVar4 == -1) goto LAB_00107579;
    lVar7 = lVar4 + 1;
    pcVar6 = name + lVar4;
    lVar4 = lVar7;
  } while (*pcVar6 != '\0');
  iVar11 = (int)name + (int)lVar7 + -1;
LAB_00107579:
  iVar11 = iVar11 - (int)name;
  if (___environ == (long *)0x0) {
    if (GetenvBeforeMain::envbuf[0] == '\0') {
      uVar5 = syscall(2,"/proc/self/environ",0);
      if ((int)uVar5 == -1) {
        RAW_VLOG(1,
                 "Unable to open /proc/self/environ, falling back on getenv(\"%s\"), which may not work"
                 ,name);
LAB_001076f4:
        pcVar6 = getenv(name);
        return pcVar6;
      }
      lVar4 = syscall(0,uVar5 & 0xffffffff,GetenvBeforeMain::envbuf,0x3ffe);
      if (lVar4 < 0) {
        RAW_VLOG(1,
                 "Unable to open /proc/self/environ, falling back on getenv(\"%s\"), which may not work"
                 ,name);
        syscall(3,uVar5 & 0xffffffff);
        goto LAB_001076f4;
      }
      syscall(3,uVar5 & 0xffffffff);
      if (GetenvBeforeMain::envbuf[0] == '\0') {
        return (char *)0x0;
      }
    }
    lVar4 = (long)iVar11;
    pcVar6 = GetenvBeforeMain::envbuf;
    do {
      pcVar9 = pcVar6 + -0x112550;
      pcVar10 = pcVar6;
      do {
        if (pcVar9 == (char *)0x0) {
          return (char *)0x0;
        }
        pcVar1 = pcVar10 + 1;
        pcVar9 = pcVar9 + 1;
        cVar2 = *pcVar10;
        pcVar10 = pcVar1;
      } while (cVar2 != '\0');
      lVar7 = 0;
      do {
        if (lVar4 == lVar7) {
          if (pcVar6[lVar4] == '=') {
            return pcVar6 + lVar4 + 1;
          }
          break;
        }
        pcVar10 = pcVar6 + lVar7;
        pcVar9 = name + lVar7;
        lVar7 = lVar7 + 1;
      } while (*pcVar10 == *pcVar9);
      pcVar6 = pcVar1;
    } while (*pcVar1 != '\0');
  }
  else {
    lVar4 = *___environ;
    if (lVar4 != 0) {
      lVar7 = (long)iVar11;
      plVar3 = ___environ;
      do {
        lVar8 = 0;
        do {
          if (lVar7 == lVar8) {
            if (*(char *)(lVar4 + lVar7) == '=') {
              return (char *)(lVar4 + lVar7 + 1);
            }
            break;
          }
          pcVar6 = (char *)(lVar4 + lVar8);
          pcVar10 = name + lVar8;
          lVar8 = lVar8 + 1;
        } while (*pcVar6 == *pcVar10);
        lVar4 = plVar3[1];
        plVar3 = plVar3 + 1;
      } while (lVar4 != 0);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* GetenvBeforeMain(const char* name) {
  const int namelen = slow_strlen(name);
#if defined(HAVE___ENVIRON)   // if we have it, it's declared in unistd.h
  if (__environ) {            // can exist but be nullptr, if statically linked
    for (char** p = __environ; *p; p++) {
      if (!slow_memcmp(*p, name, namelen) && (*p)[namelen] == '=')
        return *p + namelen+1;
    }
    return nullptr;
  }
#endif
  // static is ok because this function should only be called before
  // main(), when we're single-threaded.
  static char envbuf[16<<10];
  if (*envbuf == '\0') {    // haven't read the environ yet
    int fd = safeopen("/proc/self/environ", O_RDONLY);
    // The -2 below guarantees the last two bytes of the buffer will be \0\0
    if (fd == -1 ||           // unable to open the file, fall back onto libc
        saferead(fd, envbuf, sizeof(envbuf) - 2) < 0) { // error reading file
      RAW_VLOG(1, "Unable to open /proc/self/environ, falling back "
               "on getenv(\"%s\"), which may not work", name);
      if (fd != -1) safeclose(fd);
      return getenv(name);
    }
    safeclose(fd);
  }
  const char* p = envbuf;
  while (*p != '\0') {    // will happen at the \0\0 that terminates the buffer
    // proc file has the format NAME=value\0NAME=value\0NAME=value\0...
    const char* endp = (char*)slow_memchr(p, '\0',
                                          sizeof(envbuf) - (p - envbuf));
    if (endp == nullptr)            // this entry isn't NUL terminated
      return nullptr;
    else if (!slow_memcmp(p, name, namelen) && p[namelen] == '=')    // it's a match
      return p + namelen+1;      // point after =
    p = endp + 1;
  }
  return nullptr;                   // env var never found
}